

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O1

Torus * __thiscall SceneParser::parseTorus(SceneParser *this)

{
  Material *pMVar1;
  Torus *pTVar2;
  float fVar3;
  float fVar4;
  char token [100];
  short local_78 [52];
  
  getToken(this,(char *)local_78);
  if (local_78[0] != 0x7b) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x155,"Torus *SceneParser::parseTorus()");
  }
  getToken(this,(char *)local_78);
  if (local_78[0] != 0x52) {
    __assert_fail("!strcmp(token, \"R\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x157,"Torus *SceneParser::parseTorus()");
  }
  fVar3 = readFloat(this);
  getToken(this,(char *)local_78);
  if (local_78[0] != 0x72) {
    __assert_fail("!strcmp(token, \"r\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x15a,"Torus *SceneParser::parseTorus()");
  }
  fVar4 = readFloat(this);
  getToken(this,(char *)local_78);
  if (local_78[0] == 0x7d) {
    pMVar1 = this->_current_material;
    if (pMVar1 != (Material *)0x0) {
      pTVar2 = (Torus *)operator_new(0x38);
      (pTVar2->super_Object3D).type._M_dataplus._M_p =
           (pointer)&(pTVar2->super_Object3D).type.field_2;
      (pTVar2->super_Object3D).type._M_string_length = 0;
      (pTVar2->super_Object3D).type.field_2._M_local_buf[0] = '\0';
      (pTVar2->super_Object3D).material = pMVar1;
      (pTVar2->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Object3D_0013fb28;
      pTVar2->_R = fVar3;
      pTVar2->_r = fVar4;
      return pTVar2;
    }
    __assert_fail("_current_material != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x15e,"Torus *SceneParser::parseTorus()");
  }
  __assert_fail("!strcmp(token, \"}\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x15d,"Torus *SceneParser::parseTorus()");
}

Assistant:

Torus *
SceneParser::parseTorus() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "R"));
    float R = readFloat();
    getToken(token);
    assert(!strcmp(token, "r"));
    float r = readFloat();
    getToken(token);
    assert(!strcmp(token, "}"));
    assert(_current_material != NULL);
    return new Torus(R, r, _current_material);
}